

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawMsg.h
# Opt level: O0

RawMsg * __thiscall SocketPP::RawMsg::operator=(RawMsg *this,RawMsg *msg)

{
  RawMsg *msg_local;
  RawMsg *this_local;
  
  if (msg != this) {
    if (this->data_ != (byte *)0x0) {
      operator_delete__(this->data_);
    }
    initMsg(this,msg->data_,msg->len_);
  }
  return this;
}

Assistant:

RawMsg& operator=(const RawMsg& msg) {
        if (&msg == this)
            return *this;

        delete[] data_;
        initMsg(msg.data_, msg.len_);
        return *this;
    }